

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O1

void __thiscall
unodb::test::
tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::clear(tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
        *this)

{
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::clear
            (&this->test_db);
  allocation_failure_injector::fail_on_nth_allocation_.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  allocation_failure_injector::allocation_counter.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  assert_empty(this);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::clear(&(this->values)._M_t);
  return;
}

Assistant:

void clear() {
    test_db.clear();
#ifndef NDEBUG
    allocation_failure_injector::reset();
#endif
    assert_empty();

    values.clear();
  }